

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhosttx.cpp
# Opt level: O2

void __thiscall CVmHostIfcText::~CVmHostIfcText(CVmHostIfcText *this)

{
  CVmHashTable *this_00;
  ulong uVar1;
  
  (this->super_CVmHostIfc)._vptr_CVmHostIfc = (_func_int **)&PTR__CVmHostIfcText_0031c998;
  this_00 = this->restab_;
  if (this_00 != (CVmHashTable *)0x0) {
    CVmHashTable::~CVmHashTable(this_00);
  }
  operator_delete(this_00,0x20);
  for (uVar1 = 0; uVar1 < this->ext_cnt_; uVar1 = uVar1 + 1) {
    lib_free_str(this->ext_[uVar1]);
  }
  free(this->ext_);
  lib_free_str(this->res_dir_);
  return;
}

Assistant:

CVmHostIfcText::~CVmHostIfcText()
{
    /* delete our hash table */
    delete restab_;

    /* delete our external filenames */
    for (size_t i = 0 ; i < ext_cnt_ ; ++i)
        lib_free_str(ext_[i]);

    /* delete our array of external filename entries */
    t3free(ext_);

    /* delete our resource directory path */
    lib_free_str(res_dir_);
}